

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuThread.cpp
# Opt level: O0

void __thiscall xmrig::CpuThread::CpuThread(CpuThread *this,Value *value)

{
  bool bVar1;
  SizeType SVar2;
  uint uVar3;
  int iVar4;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar5;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RSI;
  long *in_RDI;
  
  *in_RDI = -1;
  *(undefined4 *)(in_RDI + 1) = 0;
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::IsArray(in_RSI);
  if ((bVar1) &&
     (SVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::Size(in_RSI), 1 < SVar2)) {
    SVar2 = (SizeType)((ulong)in_RDI >> 0x20);
    pGVar5 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::operator[](in_RSI,SVar2);
    uVar3 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar5);
    *(uint *)(in_RDI + 1) = uVar3;
    pGVar5 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::operator[](in_RSI,SVar2);
    iVar4 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetInt(pGVar5);
    *in_RDI = (long)iVar4;
  }
  else {
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsInt(in_RSI);
    if (bVar1) {
      *(undefined4 *)(in_RDI + 1) = 0;
      iVar4 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetInt(in_RSI);
      *in_RDI = (long)iVar4;
    }
  }
  return;
}

Assistant:

xmrig::CpuThread::CpuThread(const rapidjson::Value &value)
{
    if (value.IsArray() && value.Size() >= 2) {
        m_intensity = value[0].GetUint();
        m_affinity  = value[1].GetInt();
    }
    else if (value.IsInt()) {
        m_intensity = 0;
        m_affinity  = value.GetInt();
    }
}